

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_delete(char *_fname)

{
  long lVar1;
  void *pvVar2;
  _func_int_void_ptr_char_ptr *p_Var3;
  long *plVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  size_t sVar9;
  void **block;
  long **pplVar10;
  long **pplVar11;
  char *dst;
  PHYSFS_ErrorCode errcode;
  ulong uVar12;
  DirHandle *h;
  long *local_28;
  
  pplVar10 = &local_28;
  pplVar11 = &local_28;
  __PHYSFS_platformGrabMutex(stateLock);
  h = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    errcode = PHYSFS_ERR_NO_WRITE_DIR;
LAB_001089f9:
    PHYSFS_setErrorCode(errcode);
    __PHYSFS_platformReleaseMutex(stateLock);
    iVar5 = 0;
  }
  else {
    sVar7 = strlen(_fname);
    lVar1 = h->rootlen + sVar7;
    if (sVar7 + h->rootlen + 1 < 0x100) {
      uVar12 = lVar1 + 0x18U & 0xfffffffffffffff0;
      lVar1 = -uVar12;
      plVar8 = (long *)((long)&local_28 + lVar1);
      *(undefined8 *)((long)&local_28 - uVar12) = 0;
      local_28 = (long *)(&stack0xffffffffffffffe0 + lVar1);
      pplVar10 = (long **)plVar8;
LAB_00108999:
      sVar9 = h->rootlen;
      pplVar11 = pplVar10;
    }
    else {
      plVar8 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(lVar1 + 9);
      h = writeDir;
      if (plVar8 == (long *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_001089f9;
      }
      *plVar8 = 1;
      local_28 = plVar8 + 1;
      if (h != (DirHandle *)0x0) goto LAB_00108999;
      h = (DirHandle *)0x0;
      sVar9 = 0;
    }
    dst = (char *)((long)local_28 + sVar9);
    *(undefined8 *)((long)pplVar11 + -8) = 0x1089a8;
    iVar5 = sanitizePlatformIndependentPath(_fname,dst);
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0;
      *(undefined8 *)((long)pplVar11 + -8) = 0x1089bd;
      iVar6 = verifyPath(h,(char **)&local_28,0);
      plVar4 = local_28;
      if (iVar6 != 0) {
        pvVar2 = h->opaque;
        p_Var3 = h->funcs->remove;
        *(undefined8 *)((long)pplVar11 + -8) = 0x1089cf;
        iVar5 = (*p_Var3)(pvVar2,(char *)plVar4);
      }
    }
    *(undefined8 *)((long)pplVar11 + -8) = 0x1089e3;
    __PHYSFS_platformReleaseMutex(stateLock);
    if (*plVar8 != 0) {
      *(undefined8 *)((long)pplVar11 + -8) = 0x1089f2;
      (*__PHYSFS_AllocatorHooks.Free)(plVar8);
    }
  }
  return iVar5;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    __PHYSFS_platformGrabMutex(stateLock);
    BAIL_IF_MUTEX(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);
    len = strlen(_fname) + dirHandleRootLen(writeDir) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(fname);
    return retval;
}